

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Choice.H
# Opt level: O1

void __thiscall Fl_Choice::~Fl_Choice(Fl_Choice *this)

{
  Fl_Menu_::~Fl_Menu_(&this->super_Fl_Menu_);
  operator_delete(this,0x98);
  return;
}

Assistant:

class FL_EXPORT Fl_Choice : public Fl_Menu_ {
protected:
  void draw();
public:
  int handle(int);

  Fl_Choice(int X, int Y, int W, int H, const char *L = 0);

  /**
    Gets the index of the last item chosen by the user.
    The index is zero initially.
   */
  int value() const {return Fl_Menu_::value();}

  int value(int v);

  int value(const Fl_Menu_Item* v);
}